

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluVarType.cpp
# Opt level: O0

bool __thiscall
glu::VariableDeclaration::operator==(VariableDeclaration *this,VariableDeclaration *other)

{
  bool bVar1;
  __type local_19;
  VariableDeclaration *other_local;
  VariableDeclaration *this_local;
  
  bVar1 = Layout::operator==(&this->layout,&other->layout);
  local_19 = false;
  if (((bVar1) && (local_19 = false, this->interpolation == other->interpolation)) &&
     (local_19 = false, this->storage == other->storage)) {
    bVar1 = VarType::operator==(&this->varType,&other->varType);
    local_19 = false;
    if ((bVar1) &&
       (local_19 = false, this->memoryAccessQualifierBits == other->memoryAccessQualifierBits)) {
      local_19 = std::operator==(&this->name,&other->name);
    }
  }
  return local_19;
}

Assistant:

bool VariableDeclaration::operator== (const VariableDeclaration& other) const
{
	return	layout == other.layout &&
			interpolation == other.interpolation &&
			storage == other.storage &&
			varType == other.varType &&
			memoryAccessQualifierBits == other.memoryAccessQualifierBits &&
			name == other.name;
}